

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KaxBlockData.cpp
# Opt level: O1

void __thiscall
libmatroska::KaxReferenceBlock::SetReferencedBlock(KaxReferenceBlock *this,KaxBlockBlob *aRefdBlock)

{
  if (this->RefdBlock != (KaxBlockBlob *)0x0) {
    __assert_fail("RefdBlock == NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/gabrieleilertsen[P]lumahdrv/lib/matroska/src/KaxBlockData.cpp"
                  ,0x60,
                  "void libmatroska::KaxReferenceBlock::SetReferencedBlock(const KaxBlockBlob *)");
  }
  if (aRefdBlock != (KaxBlockBlob *)0x0) {
    FreeBlob(this);
    this->RefdBlock = aRefdBlock;
    this->bOurBlob = true;
    (this->super_EbmlSInteger).super_EbmlElement.bValueIsSet = true;
    return;
  }
  __assert_fail("aRefdBlock != NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/gabrieleilertsen[P]lumahdrv/lib/matroska/src/KaxBlockData.cpp"
                ,0x61,
                "void libmatroska::KaxReferenceBlock::SetReferencedBlock(const KaxBlockBlob *)");
}

Assistant:

void KaxReferenceBlock::SetReferencedBlock(const KaxBlockBlob * aRefdBlock)
{
  assert(RefdBlock == NULL);
  assert(aRefdBlock != NULL);
  FreeBlob();
  RefdBlock = aRefdBlock;
  bOurBlob = true;
  SetValueIsSet();
}